

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_invoke(uo_cb *cb)

{
  uo_linklist *puVar1;
  long lVar2;
  uo_linklist *puVar3;
  uo_cb_func_linklist *cb_func_linklist;
  uo_linklist *UNRECOVERED_JUMPTABLE;
  long *in_FS_OFFSET;
  
  puVar1 = (cb->funclist).next;
  if (puVar1 != &cb->funclist) {
    UNRECOVERED_JUMPTABLE = puVar1->next;
    UNRECOVERED_JUMPTABLE->prev = puVar1->prev;
    puVar1->prev->next = UNRECOVERED_JUMPTABLE;
    puVar1->next = (uo_linklist *)0x0;
    puVar1->prev = (uo_linklist *)0x0;
    UNRECOVERED_JUMPTABLE = puVar1[1].next;
    lVar2 = *in_FS_OFFSET;
    puVar3 = (uo_linklist *)in_FS_OFFSET[-4];
    puVar1->prev = puVar3;
    puVar3->next = puVar1;
    puVar1->next = (uo_linklist *)(lVar2 + -0x28);
    in_FS_OFFSET[-4] = (long)puVar1;
    (*(code *)UNRECOVERED_JUMPTABLE)();
    return;
  }
  free((cb->stack).items);
  puVar1 = &cb->funclist;
  UNRECOVERED_JUMPTABLE = (cb->funclist).next;
  if (UNRECOVERED_JUMPTABLE != puVar1) {
    lVar2 = *in_FS_OFFSET;
    do {
      puVar3 = UNRECOVERED_JUMPTABLE->next;
      puVar3->prev = UNRECOVERED_JUMPTABLE->prev;
      UNRECOVERED_JUMPTABLE->prev->next = puVar3;
      UNRECOVERED_JUMPTABLE->next = (uo_linklist *)0x0;
      UNRECOVERED_JUMPTABLE->prev = (uo_linklist *)0x0;
      puVar3 = (uo_linklist *)in_FS_OFFSET[-4];
      UNRECOVERED_JUMPTABLE->prev = puVar3;
      puVar3->next = UNRECOVERED_JUMPTABLE;
      UNRECOVERED_JUMPTABLE->next = (uo_linklist *)(lVar2 + -0x28);
      in_FS_OFFSET[-4] = (long)UNRECOVERED_JUMPTABLE;
      UNRECOVERED_JUMPTABLE = puVar1->next;
    } while (UNRECOVERED_JUMPTABLE != puVar1);
  }
  if (cb[-1].funclist.next == (uo_linklist *)0x0) {
    lVar2 = *in_FS_OFFSET;
    puVar1 = (uo_linklist *)in_FS_OFFSET[-7];
    cb[-1].funclist.prev = puVar1;
    puVar1->next = &cb[-1].funclist;
    cb[-1].funclist.next = (uo_linklist *)(lVar2 + -0x40);
    in_FS_OFFSET[-7] = (long)&cb[-1].funclist;
    return;
  }
  __assert_fail("!uo__linklist_is_linked(link)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_linklist/src/include/uo_linklist/uo_linklist.h"
                ,0xa6,"void uo__linklist_link(uo_linklist *, uo_linklist *)");
}

Assistant:

void uo_cb_invoke(
    uo_cb *cb)
{
    if (!uo_linklist_is_empty(&cb->funclist))
    {
        uo_cb_func_linklist *cb_func_linklist = (uo_cb_func_linklist *)uo_linklist_next(&cb->funclist);
        uo_linklist_unlink(cb_func_linklist);
        uo_cb_func cb_func = cb_func_linklist->item;
        uo_cb_func_linkpool_return(cb_func_linklist);
        cb_func(cb);
    }
    else
        uo_cb_destroy(cb);
}